

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall enact::UnaryExpr::~UnaryExpr(UnaryExpr *this)

{
  UnaryExpr *this_local;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__UnaryExpr_0016a600;
  Token::~Token(&this->oper);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&this->operand);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

~UnaryExpr() override = default;